

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
vkt::shaderexecutor::anon_unknown_0::getInputOutputPointers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          ,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,int numValues)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference ppvVar5;
  int scalarSize;
  Symbol *var;
  int local_38;
  int varNdx;
  int curScalarOffset;
  allocator<void_*> local_26;
  undefined1 local_25;
  int local_24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  int numValues_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *data_local;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols_local;
  vector<void_*,_std::allocator<void_*>_> *pointers;
  
  local_25 = 0;
  local_24 = numValues;
  pvStack_20 = data;
  data_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)symbols;
  symbols_local =
       (vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *)
       __return_storage_ptr__;
  sVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
          size(symbols);
  std::allocator<void_*>::allocator(&local_26);
  std::vector<void_*,_std::allocator<void_*>_>::vector(__return_storage_ptr__,sVar2,&local_26);
  std::allocator<void_*>::~allocator(&local_26);
  local_38 = 0;
  for (var._4_4_ = 0;
      sVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ::size((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                      *)data_local), var._4_4_ < (int)sVar2; var._4_4_ = var._4_4_ + 1) {
    pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[]((vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                           *)data_local,(long)var._4_4_);
    iVar1 = glu::VarType::getScalarSize(&pvVar3->varType);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (pvStack_20,(long)local_38);
    ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (__return_storage_ptr__,(long)var._4_4_);
    *ppvVar5 = pvVar4;
    local_38 = iVar1 * local_24 + local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<void*> getInputOutputPointers (const vector<Symbol>& symbols, vector<deUint32>& data, const int numValues)
{
	vector<void*>	pointers		(symbols.size());
	int				curScalarOffset	= 0;

	for (int varNdx = 0; varNdx < (int)symbols.size(); ++varNdx)
	{
		const Symbol&	var				= symbols[varNdx];
		const int		scalarSize		= var.varType.getScalarSize();

		// Uses planar layout as input/output specs do not support strides.
		pointers[varNdx] = &data[curScalarOffset];
		curScalarOffset += scalarSize*numValues;
	}

	DE_ASSERT(curScalarOffset == (int)data.size());

	return pointers;
}